

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DGXMLScanner::scanStartTag(DGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLBuffer *pXVar1;
  ElemStack *this_01;
  XMLCh XVar2;
  AttTypes AVar3;
  XMLSize_t XVar4;
  XMLCh *pXVar5;
  Grammar *pGVar6;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar7;
  XMLValidator *pXVar8;
  XMLReader *this_02;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *this_03;
  XMLDocumentHandler *pXVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  XMLCh XVar13;
  int iVar14;
  undefined4 extraout_var;
  ulong uVar16;
  DTDElementDecl *this_04;
  XMLSize_t XVar17;
  XMLCh *pXVar18;
  DTDAttDef *attDef;
  XMLAttr *this_05;
  RefHashTableBucketElem<unsigned_int> *pRVar19;
  uint *puVar20;
  undefined4 extraout_var_00;
  XMLCh *text2;
  undefined4 extraout_var_01;
  UnexpectedEOFException *this_06;
  XMLCh *pXVar21;
  RefHashTableBucketElem<unsigned_int> *pRVar22;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar23;
  XMLSize_t local_88;
  XMLSize_t failure;
  DTDElementDecl *pDVar15;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  pXVar1 = &(this->super_XMLScanner).fQNameBuf;
  (this->super_XMLScanner).fQNameBuf.fIndex = 0;
  bVar11 = XMLReader::getName((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar1,false);
  if (!bVar11) {
    XVar4 = pXVar1->fIndex;
    if (XVar4 == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    }
    else {
      pXVar5 = (this->super_XMLScanner).fQNameBuf.fBuffer;
      pXVar5[XVar4] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidElementName,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar13 = ReaderMgr::getNextChar(this_00);
      if (XVar13 == L'\0') {
        return false;
      }
    } while (XVar13 != L'<');
    return false;
  }
  XVar4 = (this->super_XMLScanner).fElemStack.fStackTop;
  pXVar5 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  pXVar5[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  pGVar6 = (this->super_XMLScanner).fGrammar;
  iVar14 = (*(pGVar6->super_XSerializable)._vptr_XSerializable[0xb])
                     (pGVar6,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0);
  pDVar15 = (DTDElementDecl *)CONCAT44(extraout_var,iVar14);
  if (pDVar15 == (DTDElementDecl *)0x0) {
    pNVar7 = this->fDTDElemNonDeclPool;
    if (pNVar7->fIdCounter != 0) {
      if ((pXVar5 == (XMLCh *)0x0) || (uVar16 = (ulong)(ushort)*pXVar5, uVar16 == 0)) {
        uVar16 = 0;
      }
      else {
        XVar13 = pXVar5[1];
        if (XVar13 != L'\0') {
          pXVar18 = pXVar5 + 2;
          do {
            uVar16 = (ulong)(ushort)XVar13 + (uVar16 >> 0x18) + uVar16 * 0x26;
            XVar13 = *pXVar18;
            pXVar18 = pXVar18 + 1;
          } while (XVar13 != L'\0');
        }
        uVar16 = uVar16 % (pNVar7->fBucketList).fHashModulus;
      }
      pRVar23 = (pNVar7->fBucketList).fBucketList[uVar16];
      if (pRVar23 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar11 = StringHasher::equals
                             ((StringHasher *)&(pNVar7->fBucketList).field_0x30,pXVar5,pRVar23->fKey
                             );
          if (bVar11) goto LAB_0029ea8e;
          pRVar23 = pRVar23->fNext;
        } while (pRVar23 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
      pRVar23 = (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0;
LAB_0029ea8e:
      if (pRVar23 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        pDVar15 = pRVar23->fData;
        goto LAB_0029ea9a;
      }
    }
    pDVar15 = (DTDElementDecl *)0x0;
  }
LAB_0029ea9a:
  this_04 = pDVar15;
  if (pDVar15 == (DTDElementDecl *)0x0) {
    this_04 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (this_04,pXVar5,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    XVar17 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_04);
    (this_04->super_XMLElementDecl).fId = XVar17;
  }
  this_01 = &(this->super_XMLScanner).fElemStack;
  if ((this->super_XMLScanner).fValidate == true) {
    if (pDVar15 == (DTDElementDecl *)0x0) {
      (this_04->super_XMLElementDecl).fCreateReason = JustFaultIn;
LAB_0029eb0c:
      XMLValidator::emitError
                ((this->super_XMLScanner).fValidator,ElementNotDefined,pXVar5,(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
    else if ((this_04->super_XMLElementDecl).fCreateReason != Declared) goto LAB_0029eb0c;
    pXVar8 = (this->super_XMLScanner).fValidator;
    (*pXVar8->_vptr_XMLValidator[9])(pXVar8,this_04);
  }
  ElemStack::addLevel(this_01,&this_04->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  if (XVar4 == 0) {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pXVar18 = (this->super_XMLScanner).fRootElemName,
       pXVar5 != pXVar18 && pXVar18 != (XMLCh *)0x0)) {
      pXVar21 = pXVar5;
      if (pXVar5 == (XMLCh *)0x0) {
LAB_0029ebc6:
        if (*pXVar18 == L'\0') goto LAB_0029ebdd;
      }
      else {
        do {
          XVar13 = *pXVar21;
          if (XVar13 == L'\0') goto LAB_0029ebc6;
          pXVar21 = pXVar21 + 1;
          XVar2 = *pXVar18;
          pXVar18 = pXVar18 + 1;
        } while (XVar13 == XVar2);
      }
      XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
    }
  }
  else if ((this->super_XMLScanner).fValidate == true) {
    ElemStack::addChild(this_01,(this_04->super_XMLElementDecl).fElementName,true);
  }
LAB_0029ebdd:
  ReaderMgr::skipPastSpaces(this_00);
  uVar16 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
           fCurCount;
  this->fElemCount = this->fElemCount + 1;
  pXVar1 = &(this->super_XMLScanner).fAttNameBuf;
  local_88 = 0;
  bVar11 = false;
  do {
    XVar13 = ReaderMgr::peekNextChar(this_00);
    if (((local_88 != 0) && (XVar13 != L'/')) && (XVar13 != L'>')) {
      if ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)XVar13] <
          '\0') {
        ReaderMgr::skipPastSpaces(this_00);
        XVar13 = ReaderMgr::peekNextChar(this_00);
      }
      else {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
      }
    }
    this_02 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    if ((this_02->fgCharCharsTable[(ushort)XVar13] & 0x10) == 0) {
      pXVar1->fIndex = 0;
      bVar12 = XMLReader::getName(this_02,pXVar1,false);
      if (bVar12) {
        bVar12 = XMLScanner::scanEq(&this->super_XMLScanner,false);
        if (!bVar12) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
          XVar13 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
          if ((ushort)XVar13 < 0x2f) {
            if ((XVar13 != L'\"') && (XVar13 != L'\'')) {
LAB_0029ee77:
              if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                             [(ushort)XVar13]) {
                iVar14 = 1;
                if (XVar13 == L'<') {
                  pXVar18 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
                  XMLScanner::emitError
                            (&this->super_XMLScanner,UnterminatedStartTag,pXVar18,(XMLCh *)0x0,
                             (XMLCh *)0x0,(XMLCh *)0x0);
                  bVar12 = false;
                }
                else {
                  bVar12 = false;
                }
                goto LAB_0029eec3;
              }
            }
            iVar14 = 0;
            bVar12 = true;
          }
          else {
            iVar14 = 2;
            bVar12 = false;
            if ((XVar13 != L'/') && (bVar12 = false, XVar13 != L'>')) goto LAB_0029ee77;
          }
LAB_0029eec3:
          if (!bVar12) goto LAB_0029f1c3;
        }
        pXVar18 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
        pXVar18[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
        attDef = DTDElementDecl::getAttDef(this_04,pXVar18);
        ReaderMgr::skipPastSpaces(this_00);
        bVar12 = scanAttValue(this,&attDef->super_XMLAttDef,pXVar18,
                              &(this->super_XMLScanner).fAttValueBuf);
        if (!bVar12) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
          XVar13 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
          if (((XVar13 != L'/') && (XVar13 != L'>')) &&
             (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                         [(ushort)XVar13])) {
            iVar14 = 1;
            iVar10 = 1;
            if (XVar13 == L'<') goto LAB_0029edfe;
            goto LAB_0029f1c3;
          }
        }
        pXVar21 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
        pXVar21[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
        if (local_88 < uVar16) {
          this_05 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                              (&((this->super_XMLScanner).fAttrList)->
                                super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,local_88);
        }
        else {
          this_05 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
          XMLAttr::XMLAttr(this_05,(this->super_XMLScanner).fMemoryManager);
          this_03 = &((this->super_XMLScanner).fAttrList)->
                     super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
          BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(this_03,1);
          XVar17 = this_03->fCurCount;
          this_03->fElemList[XVar17] = this_05;
          this_03->fCurCount = XVar17 + 1;
        }
        this_05->fSpecified = true;
        if (attDef == (DTDAttDef *)0x0) {
          QName::setName(this_05->fAttName,L"",pXVar18,0);
          XMLAttr::setValue(this_05,L"");
          this_05->fType = AttTypes_Min;
          pXVar18 = XMLAttr::getQName(this_05);
          bVar12 = Hash2KeysSetOf<xercesc_4_0::StringHasher>::putIfNotPresent
                             (this->fUndeclaredAttrRegistry,pXVar18,0);
          if (!bVar12) {
LAB_0029f113:
            text2 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
            XMLScanner::emitError
                      (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar18,text2,(XMLCh *)0x0,
                       (XMLCh *)0x0);
          }
        }
        else {
          AVar3 = (attDef->super_XMLAttDef).fType;
          QName::setName(this_05->fAttName,L"",pXVar18,0);
          XMLAttr::setValue(this_05,L"");
          this_05->fType = AVar3;
          pRVar19 = this->fAttDefRegistry->fBucketList
                    [(ulong)attDef % this->fAttDefRegistry->fHashModulus];
          pRVar22 = (RefHashTableBucketElem<unsigned_int> *)0x0;
          if (pRVar19 != (RefHashTableBucketElem<unsigned_int> *)0x0) {
            do {
              pRVar22 = pRVar19;
              if ((DTDAttDef *)pRVar19->fKey == attDef) goto LAB_0029f0c2;
              pRVar19 = pRVar19->fNext;
            } while (pRVar19 != (RefHashTableBucketElem<unsigned_int> *)0x0);
            pRVar22 = (RefHashTableBucketElem<unsigned_int> *)0x0;
          }
LAB_0029f0c2:
          if (pRVar22 == (RefHashTableBucketElem<unsigned_int> *)0x0) {
            puVar20 = (uint *)0x0;
          }
          else {
            puVar20 = pRVar22->fData;
          }
          if (puVar20 == (uint *)0x0) {
            puVar20 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
            *puVar20 = this->fElemCount;
            RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put
                      (this->fAttDefRegistry,attDef,puVar20);
          }
          else {
            if (this->fElemCount <= *puVar20) {
              iVar14 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])
                                 (attDef);
              pXVar18 = (XMLCh *)CONCAT44(extraout_var_00,iVar14);
              goto LAB_0029f113;
            }
            *puVar20 = this->fElemCount;
          }
        }
        if ((this->super_XMLScanner).fValidate == true) {
          if (attDef == (DTDAttDef *)0x0) {
            pXVar18 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
            pXVar8 = (this->super_XMLScanner).fValidator;
            pXVar18[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
            XMLValidator::emitError
                      (pXVar8,AttNotDefinedForElement,pXVar18,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          else {
            pXVar8 = (this->super_XMLScanner).fValidator;
            (this->super_XMLScanner).fAttValueBuf.fBuffer
            [(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
            (*pXVar8->_vptr_XMLValidator[8])(pXVar8,attDef);
          }
        }
        XMLAttr::setValue(this_05,pXVar21);
        local_88 = local_88 + 1;
        iVar14 = 2;
      }
      else {
        if (pXVar1->fIndex == 0) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        }
        else {
          pXVar18 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
          pXVar18[pXVar1->fIndex] = L'\0';
          XMLScanner::emitError
                    (&this->super_XMLScanner,InvalidAttrName,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        do {
          XVar13 = ReaderMgr::getNextChar(this_00);
          if (XVar13 == L'\0') break;
        } while (XVar13 != L'>');
        iVar14 = 1;
      }
    }
    else {
      iVar14 = 0;
      if ((ushort)XVar13 < 0x2f) {
        if ((XVar13 == L'\"') || (XVar13 == L'\'')) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
          ReaderMgr::getNextChar(this_00);
          ReaderMgr::skipQuotedString(this_00,XVar13);
          ReaderMgr::skipPastSpaces(this_00);
          iVar14 = 2;
        }
        else if (XVar13 == L'\0') {
          this_06 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
          UnexpectedEOFException::UnexpectedEOFException
                    (this_06,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                     ,0x582,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(this_06,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
        }
      }
      else if (XVar13 == L'/') {
        ReaderMgr::getNextChar(this_00);
        bVar12 = ReaderMgr::skippedChar(this_00,L'>');
        iVar14 = 3;
        bVar11 = true;
        iVar10 = 3;
        if (!bVar12) {
LAB_0029edfe:
          iVar14 = iVar10;
          pXVar18 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
      }
      else {
        if (XVar13 == L'<') {
          pXVar18 = QName::getRawName((this_04->super_XMLElementDecl).fElementName);
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        else {
          if (XVar13 != L'>') goto LAB_0029f1c3;
          ReaderMgr::getNextChar(this_00);
        }
        iVar14 = 3;
      }
    }
LAB_0029f1c3:
    if ((iVar14 != 0) && (iVar14 != 2)) {
      if (iVar14 != 3) {
        return false;
      }
      if (local_88 != 0) {
        Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
      }
      XVar17 = buildAttList(this,local_88,&this_04->super_XMLElementDecl,
                            (this->super_XMLScanner).fAttrList);
      pXVar9 = (this->super_XMLScanner).fDocHandler;
      if (pXVar9 != (XMLDocumentHandler *)0x0) {
        (*pXVar9->_vptr_XMLDocumentHandler[0xb])
                  (pXVar9,this_04,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
                   (this->super_XMLScanner).fAttrList,XVar17,bVar11,(ulong)(XVar4 == 0));
      }
      if (bVar11) {
        if (((this->super_XMLScanner).fValidate == true) &&
           (pXVar8 = (this->super_XMLScanner).fValidator,
           iVar14 = (*pXVar8->_vptr_XMLValidator[2])(pXVar8,this_04,0,0), (char)iVar14 == '\0')) {
          pXVar8 = (this->super_XMLScanner).fValidator;
          iVar14 = (*(this_04->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                             (this_04);
          XMLValidator::emitError
                    (pXVar8,ElementNotValidForContent,pXVar5,
                     (XMLCh *)CONCAT44(extraout_var_01,iVar14),(XMLCh *)0x0,(XMLCh *)0x0);
        }
        ElemStack::popTop(this_01);
        if (XVar4 == 0) {
          *gotData = false;
          return true;
        }
        return true;
      }
      return true;
    }
  } while( true );
}

Assistant:

bool DGXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.

    bool validName = fReaderMgr.getName(fQNameBuf);
    if (!validName)
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We *do not* tell him to fault in a decl if he does not find one - NG.
    bool wasAdded = false;
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();

    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , qnameRawBuf
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(qnameRawBuf);
    }
    if(!elemDecl)
    {
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            qnameRawBuf
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    if (fValidate) {

        if (wasAdded)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }
        // If its not marked declared, then emit an error
        else if (!elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }


        fValidator->validateElement(elemDecl);
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(qnameRawBuf, fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else if (fValidate)
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    // Ok, skip by them and peek another char
                    fReaderMgr.skipPastSpaces();
                    nextCh = fReaderMgr.peekNextChar();
                }
                 else
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.

            validName = fReaderMgr.getName(fAttNameBuf);
            if (!validName)
            {
                if (fAttNameBuf.isEmpty())
                    emitError(XMLErrs::ExpectedAttrName);
                else
                    emitError(XMLErrs::InvalidAttrName, fAttNameBuf.getRawBuffer());
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            const XMLCh* attrValue = fAttValueBuf.getRawBuffer();

            if (attCount >= curAttListSize) {
                curAtt = new (fMemoryManager) XMLAttr(fMemoryManager);
                fAttrList->addElement(curAtt);
            }
            else {
                curAtt = fAttrList->elementAt(attCount);
            }

            curAtt->setSpecified(true);

            // NO NAMESPACE CODE
            {
                curAtt->set(
                    0, namePtr, XMLUni::fgZeroLenString, XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                );

                // now need to prepare for duplicate detection
                if (attDef) {
                    unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                    if (!curCountPtr) {
                        curCountPtr = getNewUIntPtr();
                        *curCountPtr = fElemCount;
                        fAttDefRegistry->put(attDef, curCountPtr);
                    }
                    else if (*curCountPtr < fElemCount) {
                        *curCountPtr = fElemCount;
                    }
                    else {
                        emitError(
                            XMLErrs::AttrAlreadyUsedInSTag
                            , attDef->getFullName(), elemDecl->getFullName()
                        );
                    }
                }
                else
                {
                    // reset namePtr so it refers to newly-allocated memory
                    namePtr = (XMLCh *)curAtt->getQName();
                    if (!fUndeclaredAttrRegistry->putIfNotPresent(namePtr, 0))
                    {
                        emitError(
                            XMLErrs::AttrAlreadyUsedInSTag
                            , namePtr, elemDecl->getFullName()
                        );
                    }
                }
            }

            if (fValidate)
            {
                if (attDef) {
                    // Let the validator pass judgement on the attribute value
                    fValidator->validateAttrValue(
                        attDef, fAttValueBuf.getRawBuffer(), false, elemDecl
                    );
                }
                else
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer(), qnameRawBuf
                    );
                }
            }

            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(attrValue);
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(attCount, elemDecl, *fAttrList);

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    unsigned int uriId = fEmptyNamespaceId;
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , uriId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , qnameRawBuf
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    return true;
}